

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kakuro.cc
# Opt level: O0

void solve(grid *b,uint idx)

{
  bool bVar1;
  reference pvVar2;
  _Base_bitset<1UL> _Var3;
  logic_error *this;
  uint in_ESI;
  int *in_RDI;
  uint in_stack_00000010;
  uint in_stack_00000014;
  grid *in_stack_00000018;
  uint i;
  bitset<10UL> trial_numbers;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bitset<10UL> *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd4;
  grid *in_stack_ffffffffffffffd8;
  uint local_1c;
  undefined8 in_stack_ffffffffffffffe8;
  uint idx_00;
  undefined4 in_stack_fffffffffffffff0;
  
  idx_00 = (uint)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  if (in_ESI < (uint)(*in_RDI * in_RDI[1])) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 2),
                        (ulong)in_ESI);
    if (*pvVar2 == 0xffffffff) {
      solve((grid *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),idx_00);
    }
    else {
      _Var3._M_w = (_WordT)feasible_numbers(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      for (local_1c = 1; local_1c < 10; local_1c = local_1c + 1) {
        std::bitset<10UL>::operator[]
                  (in_stack_ffffffffffffffc8,
                   CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        bVar1 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffc0 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc0);
        std::bitset<10UL>::reference::~reference((reference *)&stack0xffffffffffffffd0);
        if ((in_stack_ffffffffffffffc0 & 0x1000000) != 0) {
          bVar1 = grid::put(in_stack_00000018,in_stack_00000014,in_stack_00000010);
          if (!bVar1) {
            this = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(this,"duplicate trial number");
            __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          solve((grid *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(uint)(_Var3._M_w >> 0x20));
        }
      }
      grid::put(in_stack_00000018,in_stack_00000014,in_stack_00000010);
    }
  }
  else {
    print((grid *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

static void solve(grid &b, unsigned idx)
{
	/* if we come this far, the grid contains a solution */
	if(idx >= b.rows_ * b.cols_) {
		print(b);
		return;
	}

	/*
	  for coding simplicity, we always recurse, even on nonfillable cells.
	  so skip them here..
	*/
	if(b.cells_[idx] == -1U) {
		solve(b, idx+1);
		return;
	}

	bitset<10> trial_numbers = feasible_numbers(b, idx);
	for(unsigned i = 1; i < 10; i++)
		if(trial_numbers[i]) {
			/*
			  putting should always succeed since the trial number set is
			  calculated so that it contains only not present numbers.
			*/
			if(!b.put(idx, i))
				throw logic_error("duplicate trial number");
			solve(b, idx+1);
		}

	/* UNDO number placement before backtracking */
	b.put(idx, 0);
}